

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void * lzham::lzham_default_realloc
                 (void *p,size_t size,size_t *pActual_size,lzham_bool movable,void *pUser_data)

{
  undefined8 uVar1;
  int in_ECX;
  undefined8 *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  void *p_final_block;
  void *p_new;
  undefined8 local_40;
  void *local_38;
  void *local_30;
  
  if (in_RDI == (void *)0x0) {
    local_30 = malloc(in_RSI);
    if (in_RDX != (undefined8 *)0x0) {
      if (local_30 == (void *)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = malloc_usable_size(local_30);
      }
      *in_RDX = local_40;
    }
  }
  else if (in_RSI == 0) {
    free(in_RDI);
    local_30 = (void *)0x0;
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = 0;
    }
  }
  else {
    local_30 = (void *)0x0;
    local_38 = in_RDI;
    if ((in_ECX != 0) &&
       (local_30 = realloc(in_RDI,in_RSI), local_38 = in_RDI, local_30 != (void *)0x0)) {
      local_38 = local_30;
    }
    if (in_RDX != (undefined8 *)0x0) {
      uVar1 = malloc_usable_size(local_38);
      *in_RDX = uVar1;
    }
  }
  return local_30;
}

Assistant:

static void* lzham_default_realloc(void* p, size_t size, size_t* pActual_size, lzham_bool movable, void* pUser_data)
   {
      LZHAM_NOTE_UNUSED(pUser_data);

      void* p_new;

      if (!p)
      {
         p_new = malloc(size);
         LZHAM_ASSERT( (reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0 );

         if (pActual_size)
            *pActual_size = p_new ? _msize(p_new) : 0;
      }
      else if (!size)
      {
         free(p);
         p_new = NULL;

         if (pActual_size)
            *pActual_size = 0;
      }
      else
      {
         void* p_final_block = p;
#ifdef WIN32
         p_new = _expand(p, size);
#else
         p_new = NULL;
#endif

         if (p_new)
         {
            LZHAM_ASSERT( (reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0 );
            p_final_block = p_new;
         }
         else if (movable)
         {
            p_new = realloc(p, size);

            if (p_new)
            {
               LZHAM_ASSERT( (reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0 );
               p_final_block = p_new;
            }
         }

         if (pActual_size)
            *pActual_size = _msize(p_final_block);
      }

      return p_new;
   }